

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O1

size_t __thiscall
duckdb_moodycamel::
ConcurrentQueue<duckdb::BufferEvictionNode,duckdb_moodycamel::ConcurrentQueueDefaultTraits>::
ImplicitProducer::
dequeue_bulk<__gnu_cxx::__normal_iterator<duckdb::BufferEvictionNode*,std::vector<duckdb::BufferEvictionNode,std::allocator<duckdb::BufferEvictionNode>>>>
          (ImplicitProducer *this,
          __normal_iterator<duckdb::BufferEvictionNode_*,_std::vector<duckdb::BufferEvictionNode,_std::allocator<duckdb::BufferEvictionNode>_>_>
          *itemFirst,size_t max)

{
  ImplicitProducer *pIVar1;
  _Atomic_word *p_Var2;
  long *plVar3;
  int *piVar4;
  ulong uVar5;
  long *plVar6;
  BufferEvictionNode *pBVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  size_t sVar14;
  ulong uVar15;
  long lVar16;
  BufferEvictionNode *pBVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  bool bVar21;
  
  uVar10 = (*(long *)(this + 0x38) - *(long *)(this + 0x30)) + *(long *)(this + 0x20);
  if (0 < (long)uVar10) {
    if (uVar10 < max) {
      max = uVar10;
    }
    LOCK();
    pIVar1 = this + 0x30;
    sVar14 = *(size_t *)pIVar1;
    *(size_t *)pIVar1 = *(size_t *)pIVar1 + max;
    UNLOCK();
    uVar10 = (*(long *)(this + 0x38) - sVar14) + *(long *)(this + 0x20);
    if ((long)uVar10 < 1) {
      LOCK();
      *(size_t *)(this + 0x38) = *(long *)(this + 0x38) + max;
      UNLOCK();
    }
    else {
      sVar14 = uVar10;
      if (max < uVar10) {
        sVar14 = max;
      }
      if (uVar10 < max) {
        LOCK();
        *(size_t *)(this + 0x38) = *(long *)(this + 0x38) + (max - sVar14);
        UNLOCK();
      }
      LOCK();
      pIVar1 = this + 0x28;
      uVar19 = *(ulong *)pIVar1;
      *(ulong *)pIVar1 = *(ulong *)pIVar1 + sVar14;
      UNLOCK();
      plVar6 = *(long **)(this + 0x60);
      lVar11 = (uVar19 & 0xffffffffffffffe0) - **(long **)(plVar6[3] + plVar6[1] * 8);
      lVar16 = lVar11 + 0x1f;
      if (-1 < lVar11) {
        lVar16 = lVar11;
      }
      uVar15 = *plVar6 - 1U & (lVar16 >> 5) + plVar6[1];
      uVar5 = sVar14 + uVar19;
      do {
        uVar18 = (uVar19 & 0xffffffffffffffe0) + 0x20;
        if (0x8000000000000000 < uVar5 - uVar18) {
          uVar18 = uVar5;
        }
        lVar16 = *(long *)(plVar6[3] + uVar15 * 8);
        lVar11 = *(long *)(lVar16 + 8);
        lVar12 = uVar18 - uVar19;
        uVar20 = uVar19;
        if (lVar12 != 0) {
          do {
            pBVar17 = (BufferEvictionNode *)((ulong)((uint)uVar19 & 0x1f) * 0x18 + lVar11);
            pBVar7 = itemFirst->_M_current;
            if (pBVar7 != pBVar17) {
              (pBVar7->handle).internal.
              super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (pBVar17->handle).internal.
                   super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
                        (&(pBVar7->handle).internal.
                          super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,
                         &(pBVar17->handle).internal.
                          super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
            }
            pBVar7->handle_sequence_number = pBVar17->handle_sequence_number;
            itemFirst->_M_current = itemFirst->_M_current + 1;
            p_Var8 = (pBVar17->handle).internal.
                     super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi;
            if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var2 = &p_Var8->_M_weak_count;
                iVar9 = *p_Var2;
                *p_Var2 = *p_Var2 + -1;
                UNLOCK();
              }
              else {
                iVar9 = p_Var8->_M_weak_count;
                p_Var8->_M_weak_count = iVar9 + -1;
              }
              if (iVar9 == 1) {
                (*p_Var8->_vptr__Sp_counted_base[3])();
              }
            }
            uVar19 = uVar19 + 1;
            uVar20 = uVar18;
          } while (uVar18 != uVar19);
        }
        LOCK();
        plVar3 = (long *)(lVar11 + 0x308);
        lVar13 = *plVar3;
        *plVar3 = *plVar3 + lVar12;
        UNLOCK();
        if (lVar13 + lVar12 == 0x20) {
          *(undefined8 *)(lVar16 + 8) = 0;
          lVar16 = *(long *)(this + 0x50);
          LOCK();
          piVar4 = (int *)(lVar11 + 0x330);
          iVar9 = *piVar4;
          *piVar4 = *piVar4 + -0x80000000;
          UNLOCK();
          if (iVar9 == 0) {
            lVar12 = *(long *)(lVar16 + 0x28);
            do {
              *(long *)(lVar11 + 0x338) = lVar12;
              *(undefined4 *)(lVar11 + 0x330) = 1;
              plVar3 = (long *)(lVar16 + 0x28);
              LOCK();
              lVar13 = *plVar3;
              bVar21 = lVar12 == lVar13;
              if (bVar21) {
                *plVar3 = lVar11;
                lVar13 = lVar12;
              }
              UNLOCK();
              if (bVar21) break;
              LOCK();
              piVar4 = (int *)(lVar11 + 0x330);
              iVar9 = *piVar4;
              *piVar4 = *piVar4 + 0x7fffffff;
              UNLOCK();
              lVar12 = lVar13;
            } while (iVar9 == 1);
          }
        }
        uVar15 = uVar15 + 1 & *plVar6 - 1U;
        uVar19 = uVar20;
      } while (uVar20 != uVar5);
    }
    if (0 < (long)uVar10) {
      return sVar14;
    }
  }
  return 0;
}

Assistant:

size_t dequeue_bulk(It& itemFirst, size_t max)
		{
			auto tail = this->tailIndex.load(std::memory_order_relaxed);
			auto overcommit = this->dequeueOvercommit.load(std::memory_order_relaxed);
			auto desiredCount = static_cast<size_t>(tail - (this->dequeueOptimisticCount.load(std::memory_order_relaxed) - overcommit));
			if (details::circular_less_than<size_t>(0, desiredCount)) {
				desiredCount = desiredCount < max ? desiredCount : max;
				std::atomic_thread_fence(std::memory_order_acquire);
				
				auto myDequeueCount = this->dequeueOptimisticCount.fetch_add(desiredCount, std::memory_order_relaxed);
				
				tail = this->tailIndex.load(std::memory_order_acquire);
				auto actualCount = static_cast<size_t>(tail - (myDequeueCount - overcommit));
				if (details::circular_less_than<size_t>(0, actualCount)) {
					actualCount = desiredCount < actualCount ? desiredCount : actualCount;
					if (actualCount < desiredCount) {
						this->dequeueOvercommit.fetch_add(desiredCount - actualCount, std::memory_order_release);
					}
					
					// Get the first index. Note that since there's guaranteed to be at least actualCount elements, this
					// will never exceed tail.
					auto firstIndex = this->headIndex.fetch_add(actualCount, std::memory_order_acq_rel);
					
					// Iterate the blocks and dequeue
					auto index = firstIndex;
					BlockIndexHeader* localBlockIndex;
					auto indexIndex = get_block_index_index_for_index(index, localBlockIndex);
					do {
						auto blockStartIndex = index;
						auto endIndex = (index & ~static_cast<index_t>(BLOCK_SIZE - 1)) + static_cast<index_t>(BLOCK_SIZE);
						endIndex = details::circular_less_than<index_t>(firstIndex + static_cast<index_t>(actualCount), endIndex) ? firstIndex + static_cast<index_t>(actualCount) : endIndex;
						
						auto entry = localBlockIndex->index[indexIndex];
						auto block = entry->value.load(std::memory_order_relaxed);
						if (MOODYCAMEL_NOEXCEPT_ASSIGN(T, T&&, details::deref_noexcept(itemFirst) = std::move((*(*block)[index])))) {
							while (index != endIndex) {
								auto& el = *((*block)[index]);
								*itemFirst++ = std::move(el);
								el.~T();
								++index;
							}
						}
						else {
							MOODYCAMEL_TRY {
								while (index != endIndex) {
									auto& el = *((*block)[index]);
									*itemFirst = std::move(el);
									++itemFirst;
									el.~T();
									++index;
								}
							}
							MOODYCAMEL_CATCH (...) {
								do {
									entry = localBlockIndex->index[indexIndex];
									block = entry->value.load(std::memory_order_relaxed);
									while (index != endIndex) {
										(*block)[index++]->~T();
									}
									
									if (block->ConcurrentQueue::Block::template set_many_empty<implicit_context>(blockStartIndex, static_cast<size_t>(endIndex - blockStartIndex))) {
#ifdef MCDBGQ_NOLOCKFREE_IMPLICITPRODBLOCKINDEX
										debug::DebugLock lock(mutex);
#endif
										entry->value.store(nullptr, std::memory_order_relaxed);
										this->parent->add_block_to_free_list(block);
									}
									indexIndex = (indexIndex + 1) & (localBlockIndex->capacity - 1);
									
									blockStartIndex = index;
									endIndex = (index & ~static_cast<index_t>(BLOCK_SIZE - 1)) + static_cast<index_t>(BLOCK_SIZE);
									endIndex = details::circular_less_than<index_t>(firstIndex + static_cast<index_t>(actualCount), endIndex) ? firstIndex + static_cast<index_t>(actualCount) : endIndex;
								} while (index != firstIndex + actualCount);
								
								MOODYCAMEL_RETHROW;
							}
						}
						if (block->ConcurrentQueue::Block::template set_many_empty<implicit_context>(blockStartIndex, static_cast<size_t>(endIndex - blockStartIndex))) {
							{
#ifdef MCDBGQ_NOLOCKFREE_IMPLICITPRODBLOCKINDEX
								debug::DebugLock lock(mutex);
#endif
								// Note that the set_many_empty above did a release, meaning that anybody who acquires the block
								// we're about to free can use it safely since our writes (and reads!) will have happened-before then.
								entry->value.store(nullptr, std::memory_order_relaxed);
							}
							this->parent->add_block_to_free_list(block);		// releases the above store
						}
						indexIndex = (indexIndex + 1) & (localBlockIndex->capacity - 1);
					} while (index != firstIndex + actualCount);
					
					return actualCount;
				}
				else {
					this->dequeueOvercommit.fetch_add(desiredCount, std::memory_order_release);
				}
			}
			
			return 0;
		}